

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::AddNode(ChMatterSPH *this,ChVector<double> *initial_state)

{
  ChCollisionModel *pCVar1;
  shared_ptr<chrono::ChNodeSPH> newp;
  value_type local_58;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  std::make_shared<chrono::ChNodeSPH>();
  (local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->container =
       this;
  if (&((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_ChNodeXYZ).pos != initial_state) {
    ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChNodeXYZ).pos.m_data[0] = initial_state->m_data[0];
    ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChNodeXYZ).pos.m_data[1] = initial_state->m_data[1];
    ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChNodeXYZ).pos.m_data[2] = initial_state->m_data[2];
  }
  std::
  vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>::
  push_back(&this->nodes,&local_58);
  ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->variables).
  user_data = this;
  pCVar1 = (local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           collision_model;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  (*pCVar1->_vptr_ChCollisionModel[0x13])(0x3fb999999999999a,pCVar1,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  (*(local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    collision_model->_vptr_ChCollisionModel[4])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void ChMatterSPH::AddNode(ChVector<double> initial_state) {
    auto newp = chrono_types::make_shared<ChNodeSPH>();

    newp->SetContainer(this);

    newp->SetPos(initial_state);

    nodes.push_back(newp);

    newp->variables.SetUserData((void*)this);  // UserData unuseful in future cuda solver?

    newp->collision_model->AddPoint(matsurface, 0.1);  //***TEST***
    newp->collision_model->BuildModel();   // will also add to system, if collision is on.
}